

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwl.hpp
# Opt level: O0

bool hwl::cmd_str(state *ps,string *psVal)

{
  combinator_list fs;
  combinator_list fs_00;
  undefined7 in_stack_fffffffffffffde8;
  value_type in_stack_fffffffffffffdef;
  function<bool_(parser::state_&)> *in_stack_fffffffffffffdf0;
  combinator *in_stack_fffffffffffffdf8;
  combinator *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  undefined1 **local_1d8;
  combinator *in_stack_fffffffffffffe38;
  undefined8 **ppuVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  undefined8 **ppuVar2;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  undefined1 *local_160 [8];
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 *local_f0;
  undefined1 *local_e8 [4];
  undefined1 local_c8 [32];
  undefined8 *local_a8;
  undefined8 local_a0;
  byte local_1;
  
  local_f0 = local_e8;
  std::function<bool(parser::state&)>::function<bool(&)(parser::state&),void>
            (in_stack_fffffffffffffe00,(_func_bool_state_ptr *)in_stack_fffffffffffffdf8);
  parser::literal(in_stack_fffffffffffffdef);
  local_118 = 2;
  fs._M_len = (size_type)in_stack_fffffffffffffe08;
  fs._M_array = in_stack_fffffffffffffe00;
  local_120 = local_160;
  parser::choice(fs);
  parser::look_not(in_stack_fffffffffffffdf8);
  local_f0 = (undefined8 *)local_c8;
  parser::any();
  local_a0 = 2;
  fs_00._M_len = (size_type)in_stack_fffffffffffffe08;
  fs_00._M_array = in_stack_fffffffffffffe00;
  local_a8 = local_e8;
  parser::sequence(fs_00);
  parser::memoize_many((ind)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  parser::capture(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  parser::memoize<std::__cxx11::string>
            (CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),in_stack_fffffffffffffe40
             ,in_stack_fffffffffffffe38);
  local_1 = std::function<bool_(parser::state_&)>::operator()
                      (in_stack_fffffffffffffdf0,
                       (state *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11ec74);
  std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11ec81);
  std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11ec8e);
  std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11ec9b);
  ppuVar1 = (undefined8 **)local_e8;
  ppuVar2 = &local_a8;
  do {
    ppuVar2 = ppuVar2 + -4;
    std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11ecc4);
  } while (ppuVar2 != ppuVar1);
  std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11ece5);
  local_1d8 = (undefined1 **)&local_120;
  do {
    local_1d8 = local_1d8 + -4;
    std::function<bool_(parser::state_&)>::~function((function<bool_(parser::state_&)> *)0x11ed0e);
  } while (local_1d8 != local_160);
  return (bool)(local_1 & 1);
}

Assistant:

bool cmd_str(parser::state& ps, std::string          & psVal) {
		return parser::memoize(3, psVal, parser::capture(psVal, parser::memoize_many(4, 
			parser::sequence({
				parser::look_not(
					parser::choice({
						nl,
						parser::literal('#')})),
				parser::any()}))))(ps);
	}